

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircleShape.cpp
# Opt level: O2

Vector2f __thiscall sf::CircleShape::getPoint(CircleShape *this,size_t index)

{
  Vector2f VVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_18;
  
  if ((long)(index * 2) < 0) {
    fVar3 = (float)(index & 0x7fffffffffffffff) + (float)(index & 0x7fffffffffffffff);
  }
  else {
    fVar3 = (float)(long)(index * 2);
  }
  fVar3 = (fVar3 * 3.1415927) / (float)this->m_pointCount + -1.5707964;
  fVar4 = cosf(fVar3);
  uVar2 = *(undefined8 *)&this->m_radius;
  fVar5 = sinf(fVar3);
  fVar3 = this->m_radius;
  local_18 = (float)uVar2;
  VVar1.y = fVar3 + fVar3 * fVar5;
  VVar1.x = fVar3 + local_18 * fVar4;
  return VVar1;
}

Assistant:

Vector2f CircleShape::getPoint(std::size_t index) const
{
    static const float pi = 3.141592654f;

    float angle = index * 2 * pi / m_pointCount - pi / 2;
    float x = std::cos(angle) * m_radius;
    float y = std::sin(angle) * m_radius;

    return Vector2f(m_radius + x, m_radius + y);
}